

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O3

ssize_t __thiscall
ritobin::io::text_write_impl::TextWriter::write(TextWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined8 in_RAX;
  ssize_t extraout_RAX;
  size_type __n_00;
  size_t i;
  long lVar1;
  undefined4 in_register_00000034;
  undefined8 uStack_38;
  
  this->ident_ = this->ident_ + this->indent_size_;
  uStack_38 = in_RAX;
  write_raw<3ul>(this,(char (*) [3])"{\n");
  uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
  std::vector<char,_std::allocator<char>_>::_M_fill_insert
            (this->buffer_,
             (iterator)
             (this->buffer_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish,this->ident_,(value_type *)((long)&uStack_38 + 7));
  lVar1 = 0;
  do {
    write<float>(this,*(float *)(CONCAT44(in_register_00000034,__fd) + lVar1 * 4));
    if ((~(uint)lVar1 & 3) == 0) {
      write_raw<2ul>(this,(char (*) [2])0x13aee0);
      __n_00 = this->ident_;
      if (lVar1 == 0xf) {
        __n_00 = __n_00 - this->indent_size_;
        this->ident_ = __n_00;
      }
      uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
      std::vector<char,_std::allocator<char>_>::_M_fill_insert
                (this->buffer_,
                 (iterator)
                 (this->buffer_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,__n_00,(value_type *)((long)&uStack_38 + 6));
    }
    else {
      write_raw<3ul>(this,(char (*) [3])", ");
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  write_raw<2ul>(this,(char (*) [2])0x1348b5);
  return extraout_RAX;
}

Assistant:

void write(std::array<float, 16> const& value) noexcept {
            ident_inc();
            write_raw("{\n");
            pad();
            for (size_t i = 0; i < 16; i++) {
                write(value[i]);
                if (i % 4 == 3) {
                    write_raw("\n");
                    if (i == 15) {
                        ident_dec();
                    }
                    pad();
                } else {
                    write_raw(", ");
                }
            }
            write_raw("}");
        }